

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

type __thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
new_selector<jsoncons::jsonpath::detail::function_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>
          (static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
           *this,function_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *val)

{
  size_t sVar1;
  pointer ptVar2;
  __uniq_ptr_impl<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  local_20;
  
  local_20._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
  ._M_head_impl =
       (tuple<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
        )operator_new(0x40);
  sVar1 = (val->
          super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ).
          super_jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          .precedence_level_;
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                  .
                  super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
                  ._M_head_impl + 8) =
       *(long *)&(val->
                 super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ).
                 super_jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 .is_path_;
  *(size_t *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
          ._M_head_impl + 0x10) = sVar1;
  *(supertype **)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
          ._M_head_impl + 0x18) =
       (val->
       super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
       ).tail_;
  *(undefined ***)
   local_20._M_t.
   super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
   .
   super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
   ._M_head_impl = &PTR__function_selector_00b38978;
  *(undefined ***)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
          ._M_head_impl + 0x20) = &PTR__token_evaluator_00b38820;
  ptVar2 = (val->expr_).token_list_.
           super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
          ._M_head_impl + 0x28) =
       (val->expr_).token_list_.
       super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
          ._M_head_impl + 0x30) = ptVar2;
  *(pointer *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
          ._M_head_impl + 0x38) =
       (val->expr_).token_list_.
       super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (val->expr_).token_list_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (val->expr_).token_list_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (val->expr_).token_list_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>>>
            ((vector<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>,std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>>>>
              *)(this + 8),
             (unique_ptr<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
              *)&local_20);
  if ((_Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
       )local_20._M_t.
        super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
        .
        super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
        ._M_head_impl !=
      (jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
       *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_std::default_delete<jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                          .
                          super__Head_base<0UL,_jsoncons::jsonpath::detail::jsonpath_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_*,_false>
                          ._M_head_impl + 8))();
  }
  return *(type *)(*(long *)(this + 0x10) + -8);
}

Assistant:

typename std::enable_if<!std::is_const<typename std::remove_reference<typename T::reference>::type>::value,selector_type*>::type    
        new_selector(T&& val)
        {
            selectors_.push_back(jsoncons::make_unique<T>(std::forward<T>(val)));
            return selectors_.back().get();
        }